

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-not-writable-after-shutdown.c
# Opt level: O1

int run_test_not_writable_after_shutdown(void)

{
  int iVar1;
  undefined8 unaff_RBX;
  long *plVar2;
  int64_t eval_b_1;
  int64_t eval_b_2;
  sockaddr_in addr;
  uv_connect_t connect_req;
  uv_tcp_t socket;
  long lStack_178;
  code *pcStack_170;
  long local_168;
  long local_160;
  undefined1 local_158 [16];
  long local_148 [13];
  long local_e0 [27];
  
  plVar2 = &local_168;
  pcStack_170 = (code *)0x1aec96;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_158);
  local_e0[0] = (long)iVar1;
  local_148[0] = 0;
  if (local_e0[0] == 0) {
    pcStack_170 = (code *)0x1aecc1;
    unaff_RBX = uv_default_loop();
    pcStack_170 = (code *)0x1aecd4;
    iVar1 = uv_tcp_init(unaff_RBX,local_e0);
    local_148[0] = (long)iVar1;
    local_168 = 0;
    if (local_148[0] != 0) goto LAB_001aedb1;
    pcStack_170 = (code *)0x1aed10;
    iVar1 = uv_tcp_connect(local_148,local_e0,local_158,connect_cb);
    local_168 = (long)iVar1;
    local_160 = 0;
    if (local_168 != 0) goto LAB_001aedbe;
    pcStack_170 = (code *)0x1aed38;
    iVar1 = uv_run(unaff_RBX,0);
    local_168 = (long)iVar1;
    local_160 = 0;
    if (local_168 != 0) goto LAB_001aedcb;
    pcStack_170 = (code *)0x1aed63;
    uv_walk(unaff_RBX,close_walk_cb,0);
    pcStack_170 = (code *)0x1aed6d;
    uv_run(unaff_RBX,0);
    local_168 = 0;
    pcStack_170 = (code *)0x1aed7d;
    iVar1 = uv_loop_close(unaff_RBX);
    local_160 = (long)iVar1;
    if (local_168 == local_160) {
      pcStack_170 = (code *)0x1aed94;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_170 = (code *)0x1aedb1;
    run_test_not_writable_after_shutdown_cold_1();
LAB_001aedb1:
    pcStack_170 = (code *)0x1aedbe;
    run_test_not_writable_after_shutdown_cold_2();
LAB_001aedbe:
    pcStack_170 = (code *)0x1aedcb;
    run_test_not_writable_after_shutdown_cold_3();
LAB_001aedcb:
    pcStack_170 = (code *)0x1aedd8;
    run_test_not_writable_after_shutdown_cold_4();
  }
  iVar1 = (int)&local_160;
  pcStack_170 = connect_cb;
  run_test_not_writable_after_shutdown_cold_5();
  lStack_178 = (long)iVar1;
  pcStack_170 = (code *)unaff_RBX;
  if (lStack_178 == 0) {
    iVar1 = uv_shutdown(&shutdown_req,*(undefined8 *)((long)plVar2 + 0x50),shutdown_cb);
    lStack_178 = (long)iVar1;
    if (lStack_178 == 0) {
      iVar1 = uv_is_writable(*(undefined8 *)((long)plVar2 + 0x50));
      lStack_178 = (long)iVar1;
      if (lStack_178 == 0) {
        return iVar1;
      }
      goto LAB_001aee7c;
    }
  }
  else {
    connect_cb_cold_1();
  }
  connect_cb_cold_2();
LAB_001aee7c:
  plVar2 = &lStack_178;
  connect_cb_cold_3();
  iVar1 = uv_close(plVar2[9],close_cb);
  return iVar1;
}

Assistant:

TEST_IMPL(not_writable_after_shutdown) {
  int r;
  struct sockaddr_in addr;
  uv_loop_t* loop;
  uv_tcp_t socket;
  uv_connect_t connect_req;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  loop = uv_default_loop();

  r = uv_tcp_init(loop, &socket);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     &socket,
                     (const struct sockaddr*) &addr,
                     connect_cb);
  ASSERT_OK(r);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}